

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void baryonyx::itm::
     init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>
               (bit_array *x_pessimistic,bit_array *x_optimistic,random_engine *rng,
               quadratic_cost_type<long_double> *c,
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *constraints,double init_random)

{
  pointer pmVar1;
  pointer pfVar2;
  longdouble *plVar3;
  quad *pqVar4;
  bool bVar5;
  byte bVar6;
  undefined1 auVar7 [16];
  longdouble *plVar8;
  pointer prVar9;
  pointer prVar10;
  pointer pmVar11;
  ulong uVar12;
  int *piVar13;
  long unaff_RBX;
  merged_constraint *cst;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  size_type __n;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  quad *pqVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  longdouble lVar33;
  double dVar34;
  undefined1 auVar35 [64];
  vector<reduced_cost,_std::allocator<reduced_cost>_> R;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  allocator_type local_71;
  ulong local_70;
  vector<reduced_cost,_std::allocator<reduced_cost>_> local_68;
  random_engine *local_50;
  quadratic_cost_type<long_double> *local_48;
  pointer local_40;
  double local_38;
  undefined1 auVar27 [32];
  
  pmVar11 = (constraints->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pmVar1 = (constraints->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pmVar11 == pmVar1) {
    __n = 0;
  }
  else {
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx2(_DAT_00622f60);
    lVar17 = -0x28 - (long)pmVar11;
    uVar12 = 0;
    auVar29 = vpbroadcastq_avx512f();
    auVar30 = vpsrlq_avx512f(auVar29,5);
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar35 = auVar29;
      auVar29 = vpbroadcastq_avx512f();
      uVar12 = uVar12 + 8;
      auVar29 = vporq_avx512f(auVar29,auVar28);
      uVar21 = vpcmpuq_avx512f(auVar29,auVar30,2);
      auVar29 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(pmVar11->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + unaff_RBX))
      ;
      bVar6 = (byte)uVar21;
      auVar31._8_8_ = (ulong)((byte)(uVar21 >> 1) & 1) * auVar29._8_8_;
      auVar31._0_8_ = (ulong)(bVar6 & 1) * auVar29._0_8_;
      auVar31._16_8_ = (ulong)((byte)(uVar21 >> 2) & 1) * auVar29._16_8_;
      auVar31._24_8_ = (ulong)((byte)(uVar21 >> 3) & 1) * auVar29._24_8_;
      auVar31._32_8_ = (ulong)((byte)(uVar21 >> 4) & 1) * auVar29._32_8_;
      auVar31._40_8_ = (ulong)((byte)(uVar21 >> 5) & 1) * auVar29._40_8_;
      auVar31._48_8_ = (ulong)((byte)(uVar21 >> 6) & 1) * auVar29._48_8_;
      auVar31._56_8_ = (uVar21 >> 7) * auVar29._56_8_;
      auVar29 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(pmVar11->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_start + unaff_RBX));
      auVar32._8_8_ = (ulong)((byte)(uVar21 >> 1) & 1) * auVar29._8_8_;
      auVar32._0_8_ = (ulong)(bVar6 & 1) * auVar29._0_8_;
      auVar32._16_8_ = (ulong)((byte)(uVar21 >> 2) & 1) * auVar29._16_8_;
      auVar32._24_8_ = (ulong)((byte)(uVar21 >> 3) & 1) * auVar29._24_8_;
      auVar32._32_8_ = (ulong)((byte)(uVar21 >> 4) & 1) * auVar29._32_8_;
      auVar32._40_8_ = (ulong)((byte)(uVar21 >> 5) & 1) * auVar29._40_8_;
      auVar32._48_8_ = (ulong)((byte)(uVar21 >> 6) & 1) * auVar29._48_8_;
      auVar32._56_8_ = (uVar21 >> 7) * auVar29._56_8_;
      pmVar11 = pmVar11 + 8;
      auVar29 = vpsubq_avx512f(auVar31,auVar32);
      auVar29 = vpsrlq_avx512f(auVar29,3);
      auVar26 = vpmovqd_avx512f(auVar29);
      auVar26 = vpmaxsd_avx2(auVar35._0_32_,auVar26);
      auVar29 = ZEXT3264(auVar26);
    } while (((ulong)((long)pmVar1 + lVar17) / 0x28 + 8 & 0xfffffffffffffff8) != uVar12);
    auVar26 = vmovdqa32_avx512vl(auVar26);
    auVar25._0_4_ = (uint)(bVar6 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar35._0_4_;
    bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
    auVar25._4_4_ = (uint)bVar5 * auVar26._4_4_ | (uint)!bVar5 * auVar35._4_4_;
    bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
    auVar25._8_4_ = (uint)bVar5 * auVar26._8_4_ | (uint)!bVar5 * auVar35._8_4_;
    bVar5 = (bool)((byte)(uVar21 >> 3) & 1);
    auVar25._12_4_ = (uint)bVar5 * auVar26._12_4_ | (uint)!bVar5 * auVar35._12_4_;
    bVar5 = (bool)((byte)(uVar21 >> 4) & 1);
    auVar27._16_4_ = (uint)bVar5 * auVar26._16_4_ | (uint)!bVar5 * auVar35._16_4_;
    auVar27._0_16_ = auVar25;
    bVar5 = (bool)((byte)(uVar21 >> 5) & 1);
    auVar27._20_4_ = (uint)bVar5 * auVar26._20_4_ | (uint)!bVar5 * auVar35._20_4_;
    bVar5 = (bool)((byte)(uVar21 >> 6) & 1);
    auVar27._24_4_ = (uint)bVar5 * auVar26._24_4_ | (uint)!bVar5 * auVar35._24_4_;
    bVar5 = SUB81(uVar21 >> 7,0);
    auVar27._28_4_ = (uint)bVar5 * auVar26._28_4_ | (uint)!bVar5 * auVar35._28_4_;
    auVar25 = vpmaxsd_avx(auVar25,auVar27._16_16_);
    auVar7 = vpshufd_avx(auVar25,0xee);
    auVar25 = vpmaxsd_avx(auVar25,auVar7);
    auVar7 = vpshufd_avx(auVar25,0x55);
    auVar25 = vpmaxsd_avx(auVar25,auVar7);
    __n = CONCAT44((int)((ulong)x_optimistic >> 0x20),auVar25._0_4_);
  }
  local_50 = rng;
  local_48 = c;
  local_38 = init_random;
  std::vector<reduced_cost,_std::allocator<reduced_cost>_>::vector(&local_68,__n,&local_71);
  local_40 = (constraints->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pmVar11 = (constraints->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pmVar11 != local_40) {
    do {
      dVar34 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (local_50);
      if (dVar34 < local_38) {
        std::vector<reduced_cost,_std::allocator<reduced_cost>_>::resize
                  (&local_68,
                   (long)(pmVar11->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pmVar11->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        pfVar2 = (pmVar11->elements).
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_70 = (ulong)((long)(pmVar11->elements).
                                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar2) >> 3;
        if ((int)local_70 != 0) {
          plVar3 = (local_48->linear_elements)._M_t.
                   super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                   super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                   super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
          pqVar4 = (local_48->quadratic_elements)._M_t.
                   super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                   .
                   super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>
                   ._M_head_impl;
          piVar13 = (local_48->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                    ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl;
          uVar12 = 0;
          do {
            iVar19 = pfVar2[uVar12].variable_index;
            lVar33 = plVar3[iVar19];
            iVar15 = piVar13[iVar19];
            iVar14 = piVar13[(long)iVar19 + 1];
            if (iVar14 != iVar15) {
              iVar14 = iVar14 - iVar15;
              pqVar23 = pqVar4 + iVar15;
              do {
                plVar8 = &pqVar23->factor;
                pqVar23 = pqVar23 + 1;
                iVar14 = iVar14 + -1;
                lVar33 = *plVar8 + lVar33;
              } while (iVar14 != 0);
            }
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12].value = (float)lVar33;
            uVar21 = uVar12 + 1;
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12].factor = pfVar2[uVar12].factor;
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12].id = iVar19;
            uVar12 = uVar21;
          } while (uVar21 != (local_70 & 0xffffffff));
        }
        std::
        shuffle<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  ((__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                    )local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                    )local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_finish,local_50);
        prVar10 = local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        prVar9 = local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (int)LZCOUNT(((long)local_68.
                                         super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_68.
                                         super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                  -0x5555555555555555) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<long_double>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar9,prVar10);
        }
        if ((x_pessimistic->super_bit_array_impl).m_data._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          if (-1 < (int)(uint)local_70) {
            uVar12 = (ulong)((uint)local_70 & 0x7fffffff);
            uVar21 = 0;
            iVar19 = 0;
            piVar13 = &(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                        _M_impl.super__Vector_impl_data._M_start)->factor;
LAB_001c056d:
            if ((iVar19 < pmVar11->min) || (pmVar11->max < iVar19)) goto LAB_001c0577;
            if (-1 < (long)(uVar21 - 1)) {
              lVar17 = 8;
              uVar12 = uVar21;
              do {
                bit_array_impl::set(&x_pessimistic->super_bit_array_impl,
                                    *(int *)((long)&(local_68.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                            + lVar17));
                lVar17 = lVar17 + 0xc;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 0);
              goto LAB_001c05bb;
            }
          }
LAB_001c05b8:
          uVar21 = 0;
LAB_001c05bb:
          if ((int)uVar21 != (int)local_70) {
            lVar17 = (uVar21 & 0xffffffff) * 0xc + 8;
            lVar24 = (uVar21 & 0xffffffff) - (local_70 & 0xffffffff);
            do {
              bit_array_impl::unset
                        (&x_pessimistic->super_bit_array_impl,
                         *(int *)((long)&(local_68.
                                          super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->value + lVar17
                                 ));
              lVar17 = lVar17 + 0xc;
              lVar24 = lVar24 + 1;
            } while (lVar24 != 0);
          }
        }
        uVar22 = (uint)local_70;
        if ((x_optimistic->super_bit_array_impl).m_data._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          if ((int)uVar22 < 0) {
LAB_001c06a5:
            uVar16 = 0;
          }
          else {
            uVar21 = (ulong)(uVar22 & 0x7fffffff);
            uVar20 = 0xffffffffffffffff;
            iVar19 = 0;
            piVar13 = &(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                        _M_impl.super__Vector_impl_data._M_start)->factor;
            uVar12 = 0xfffffffe;
            do {
              uVar18 = uVar20 & 0xffffffff;
              if (pmVar11->max < iVar19) {
                uVar18 = uVar12;
              }
              if (iVar19 < pmVar11->min) {
                uVar18 = uVar12;
              }
              uVar20 = uVar20 + 1;
              iVar15 = (int)uVar18;
              if (((iVar15 != -2) && ((long)uVar20 < (long)uVar21)) &&
                 (0.0 < ((reduced_cost *)(piVar13 + -1))->value)) break;
              if ((long)uVar20 < (long)uVar21) {
                iVar19 = iVar19 + *piVar13;
              }
              piVar13 = piVar13 + 3;
              uVar12 = uVar18;
            } while (uVar21 != uVar20);
            if (iVar15 < 0) goto LAB_001c06a5;
            uVar16 = iVar15 + 1;
            lVar17 = 0;
            do {
              bit_array_impl::set(&x_optimistic->super_bit_array_impl,
                                  *(int *)((long)&(local_68.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id +
                                          lVar17));
              lVar17 = lVar17 + 0xc;
            } while (uVar18 * 0xc + 0xc != lVar17);
            uVar22 = (uint)local_70;
          }
          if (uVar16 != uVar22) {
            lVar24 = (ulong)uVar16 - (ulong)uVar22;
            lVar17 = (ulong)uVar16 * 0xc + 8;
            do {
              bit_array_impl::unset
                        (&x_optimistic->super_bit_array_impl,
                         *(int *)((long)&(local_68.
                                          super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->value + lVar17
                                 ));
              lVar17 = lVar17 + 0xc;
              lVar24 = lVar24 + 1;
            } while (lVar24 != 0);
          }
        }
      }
      pmVar11 = pmVar11 + 1;
    } while (pmVar11 != local_40);
  }
  if (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
      super__Vector_impl_data._M_start != (reduced_cost *)0x0) {
    operator_delete(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
LAB_001c0577:
  if ((long)uVar21 < (long)uVar12) {
    iVar19 = iVar19 + *piVar13;
  }
  uVar21 = uVar21 + 1;
  piVar13 = piVar13 + 3;
  if (uVar12 + 1 == uVar21) goto LAB_001c05b8;
  goto LAB_001c056d;
}

Assistant:

void
init_with_pre_solve(bit_array& x_pessimistic,
                    bit_array& x_optimistic,
                    random_engine& rng,
                    const Cost& c,
                    const std::vector<merged_constraint>& constraints,
                    const double init_random) noexcept
{
    int max_length = 0;
    for (const auto& cst : constraints)
        if (length(cst.elements) > max_length)
            max_length = length(cst.elements);

    struct reduced_cost
    {
        float value;
        int factor;
        int id;
    };

    std::vector<reduced_cost> R(max_length);
    std::bernoulli_distribution dist(init_random);

    for (const auto& cst : constraints) {
        if (!dist(rng))
            continue;

        R.resize(cst.elements.size());
        const int r_size = length(cst.elements);

        for (int i = 0; i != r_size; ++i) {
            R[i].value = static_cast<float>(c[cst.elements[i].variable_index]);
            R[i].factor = cst.elements[i].factor;
            R[i].id = cst.elements[i].variable_index;
        }

        std::shuffle(std::begin(R), std::end(R), rng);
        std::sort(
          std::begin(R), std::end(R), [](const auto& lhs, const auto& rhs) {
              return is_better_solution<Mode>(lhs.value, rhs.value);
          });

        if (!x_pessimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max) {
                    best = i;
                    break;
                }

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_pessimistic.set(R[i].id);

            for (; i != r_size; ++i) {
                x_pessimistic.unset(R[i].id);
            }
        }

        if (!x_optimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max)
                    best = i;

                if (best != -2 && i + 1 < r_size &&
                    stop_iterating<Mode>(R[i + 1].value))
                    break;

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_optimistic.set(R[i].id);

            for (; i != r_size; ++i)
                x_optimistic.unset(R[i].id);
        }
    }
}